

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * internal_exr_alloc_aligned
                 (_func_void_ptr_size_t *alloc_fn,void **tofreeptr,size_t bytes,size_t align)

{
  ulong in_RCX;
  long in_RDX;
  ulong *in_RSI;
  code *in_RDI;
  uintptr_t off;
  void *ret;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  if ((in_RCX == 1) || (local_20 = in_RCX, 0x1000 < in_RCX)) {
    local_20 = 0;
  }
  local_28 = (void *)(*in_RDI)(in_RDX + local_20);
  *in_RSI = (ulong)local_28;
  if (local_28 != (void *)0x0) {
    local_30 = (ulong)local_28 & local_20 - 1;
    if (local_30 != 0) {
      local_30 = local_20 - local_30;
    }
    local_28 = (void *)((long)local_28 + local_30);
  }
  return local_28;
}

Assistant:

void*
internal_exr_alloc_aligned (
    void* (*alloc_fn) (size_t), void** tofreeptr, size_t bytes, size_t align)
{
    void* ret;
    if (align == 1 || align > 4096) { align = 0; }

    ret        = alloc_fn (bytes + align);
    *tofreeptr = ret;
    if (ret)
    {
        uintptr_t off = ((uintptr_t) ret) & (align - 1);
        if (off) off = align - off;
        ret = (((uint8_t*) ret) + off);
    }
    return ret;
}